

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callbacks.cpp
# Opt level: O3

IDeckLinkNotificationCallback *
cdecklink_internal_callback_create_deck_link_notification_callback
          (void *ctx,cdecklink_notification_callback_notify *cb0)

{
  IDeckLinkNotificationCallback *pIVar1;
  
  if (cb0 != (cdecklink_notification_callback_notify *)0x0) {
    pIVar1 = (IDeckLinkNotificationCallback *)operator_new(0x20);
    (pIVar1->super_IUnknown)._vptr_IUnknown = (_func_int **)&PTR_QueryInterface_00108cf8;
    *(undefined4 *)&pIVar1[1].super_IUnknown._vptr_IUnknown = 0;
    pIVar1[2].super_IUnknown._vptr_IUnknown = (_func_int **)ctx;
    pIVar1[3].super_IUnknown._vptr_IUnknown = (_func_int **)cb0;
    return pIVar1;
  }
  return (IDeckLinkNotificationCallback *)0x0;
}

Assistant:

IDeckLinkNotificationCallback* cdecklink_internal_callback_create_deck_link_notification_callback (void *ctx, cdecklink_notification_callback_notify *cb0) {
	if (cb0 != nullptr) {
		return new DeckLinkNotificationCallback(ctx, cb0);
	}
	return nullptr;
}